

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O0

void updateSize(void)

{
  ostream *poVar1;
  int in_EDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  int local_50;
  int local_4c;
  Point_<int> local_48;
  Point_<float> local_40;
  Point_<int> local_38;
  Point_<float> local_30;
  Point_<int> local_28;
  Point_<float> local_20;
  int local_18;
  int local_14;
  int BDy;
  int ACy;
  int CDx;
  int ABx;
  
  std::abs(in_EDI);
  ACy = (int)extraout_XMM0_Da;
  std::abs(in_EDI);
  BDy = (int)extraout_XMM0_Da_00;
  local_4c = BDy;
  if (BDy <= ACy) {
    local_4c = ACy;
  }
  windowResultWidth = local_4c;
  std::abs(in_EDI);
  local_14 = (int)extraout_XMM0_Da_01;
  std::abs(in_EDI);
  local_18 = (int)extraout_XMM0_Da_02;
  local_50 = local_18;
  if (local_18 <= local_14) {
    local_50 = local_14;
  }
  windowResultHeight = local_50;
  cv::Point_<int>::Point_(&local_28,windowResultWidth,0);
  cv::Point_::operator_cast_to_Point_((Point_ *)&local_20);
  cv::Point_<float>::operator=(calibrationSecondArray + 1,&local_20);
  cv::Point_<int>::Point_(&local_38,0,windowResultHeight);
  cv::Point_::operator_cast_to_Point_((Point_ *)&local_30);
  cv::Point_<float>::operator=(calibrationSecondArray + 2,&local_30);
  cv::Point_<int>::Point_(&local_48,windowResultWidth,windowResultHeight);
  cv::Point_::operator_cast_to_Point_((Point_ *)&local_40);
  cv::Point_<float>::operator=(calibrationSecondArray + 3,&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nWarped View now displays a ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,windowResultWidth);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,windowResultHeight);
  poVar1 = std::operator<<(poVar1," frame");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void updateSize(){
    int ABx = abs(calibrationFirstArray[0].x - calibrationFirstArray[1].x);
    int CDx =  abs(calibrationFirstArray[2].x - calibrationFirstArray[3].x);
    windowResultWidth = ABx < CDx ? CDx : ABx;
    int ACy = abs(calibrationFirstArray[0].y - calibrationFirstArray[2].y);
    int BDy =  abs(calibrationFirstArray[1].y - calibrationFirstArray[3].y);
    windowResultHeight = ACy < BDy ? BDy : ACy;
    calibrationSecondArray[1]= Point(windowResultWidth, 0);
    calibrationSecondArray[2] = Point(0, windowResultHeight);
    calibrationSecondArray[3] = Point(windowResultWidth, windowResultHeight);
    cout<<"\nWarped View now displays a "<<windowResultWidth<<"x"<<windowResultHeight<<" frame"<<endl;

}